

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_> *
Jinx::Impl::ReplaceUtf8CharAtIndex
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
           *__return_storage_ptr__,String *dest,String *source,int64_t index)

{
  size_type sVar1;
  char *pcVar2;
  undefined8 *puVar3;
  size_t sVar4;
  pointer pcVar5;
  char *pcVar6;
  pointer utf8Str;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_60;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  *local_40;
  pointer local_38;
  
  utf8Str = (dest->_M_dataplus)._M_p;
  sVar1 = dest->_M_string_length;
  pcVar2 = GetUtf8CstrByIndex(dest,index);
  if (pcVar2 == (char *)0x0) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
    ._M_engaged = false;
    return __return_storage_ptr__;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_40 = __return_storage_ptr__;
  if ((long)sVar1 < 1) {
    puVar3 = (undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                     ._M_payload + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
      ._M_payload = puVar3;
  }
  else {
    pcVar5 = utf8Str + sVar1;
    local_38 = pcVar5;
    do {
      if (utf8Str == pcVar2) {
        if (0 < (long)source->_M_string_length) {
          pcVar5 = (source->_M_dataplus)._M_p;
          pcVar6 = pcVar5 + source->_M_string_length;
          do {
            for (sVar4 = GetUtf8CharSize(pcVar5); sVar4 != 0; sVar4 = sVar4 - 1) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              push_back(&local_60,*pcVar5);
              pcVar5 = pcVar5 + 1;
            }
          } while (pcVar5 < pcVar6);
        }
        sVar4 = GetUtf8CharSize(utf8Str);
        pcVar5 = local_38;
      }
      else {
        sVar4 = 1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::push_back
                  (&local_60,*utf8Str);
      }
      utf8Str = utf8Str + sVar4;
    } while (utf8Str < pcVar5);
    puVar3 = (undefined8 *)
             ((long)&(local_40->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                     ._M_payload + 0x10);
    *(undefined8 **)
     &(local_40->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
      ._M_payload = puVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      (local_40->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = local_60._M_dataplus._M_p;
      *(ulong *)((long)&(local_40->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                        ._M_payload + 0x10) =
           CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,local_60.field_2._M_local_buf[0]);
      goto LAB_00112d8f;
    }
  }
  *puVar3 = CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,local_60.field_2._M_local_buf[0]);
  puVar3[1] = local_60.field_2._8_8_;
LAB_00112d8f:
  (local_40->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  ._M_payload._M_value._M_string_length = local_60._M_string_length;
  (local_40->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
  ._M_engaged = true;
  return local_40;
}

Assistant:

inline_t std::optional<String> ReplaceUtf8CharAtIndex(const String & dest, const String & source, int64_t index)
	{
		const char * destStart = dest.c_str();
		const char * destEnd = destStart + dest.size();
		const char * destTarget = GetUtf8CstrByIndex(dest, index);
		if (destTarget == nullptr)
			return std::optional<String>();
		String out;
		const char * destCurr = destStart;
		while (destCurr < destEnd)
		{
			if (destCurr == destTarget)
			{
				const char * srcCurr = source.c_str();
				const char * srcEnd = srcCurr + source.size();
				while (srcCurr < srcEnd)
				{
					size_t charCount = GetUtf8CharSize(srcCurr);
					for (size_t i = 0; i < charCount; ++i)
					{
						out += *srcCurr;
						++srcCurr;
					}
				}
				size_t size = GetUtf8CharSize(destCurr);
				destCurr += size;
			}
			else
			{
				out += *destCurr;
				++destCurr;
			}
		}
		return out;
	}